

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

int * Extra_DeriveRadixCode(int Number,int Radix,int nDigits)

{
  int local_18;
  int i;
  int nDigits_local;
  int Radix_local;
  int Number_local;
  
  if (99 < nDigits) {
    __assert_fail("nDigits < 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                  ,0xa4,"int *Extra_DeriveRadixCode(int, int, int)");
  }
  nDigits_local = Number;
  for (local_18 = 0; local_18 < nDigits; local_18 = local_18 + 1) {
    Extra_DeriveRadixCode::Code[local_18] = nDigits_local % Radix;
    nDigits_local = nDigits_local / Radix;
  }
  if (nDigits_local == 0) {
    return Extra_DeriveRadixCode::Code;
  }
  __assert_fail("Number == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                ,0xaa,"int *Extra_DeriveRadixCode(int, int, int)");
}

Assistant:

int * Extra_DeriveRadixCode( int Number, int Radix, int nDigits )
{
    static int Code[100];
    int i;
    assert( nDigits < 100 );
    for ( i = 0; i < nDigits; i++ )
    {
        Code[i] = Number % Radix;
        Number  = Number / Radix;
    }
    assert( Number == 0 );
    return Code;
}